

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O2

char * __thiscall bsplib::exception::what(exception *this)

{
  string local_30 [32];
  
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->m_buf,local_30);
  std::__cxx11::string::~string(local_30);
  return (this->m_buf)._M_dataplus._M_p;
}

Assistant:

virtual const char * what() const throw()
    { m_buf = m_stream.str();
      return m_buf.c_str(); 
    }